

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_action.cpp
# Opt level: O0

void FaceMovementDirection(AActor *actor)

{
  AActor *actor_local;
  
  switch(actor->movedir) {
  case '\0':
    TAngle<double>::operator=(&(actor->Angles).Yaw,0.0);
    break;
  case '\x01':
    TAngle<double>::operator=(&(actor->Angles).Yaw,45.0);
    break;
  case '\x02':
    TAngle<double>::operator=(&(actor->Angles).Yaw,90.0);
    break;
  case '\x03':
    TAngle<double>::operator=(&(actor->Angles).Yaw,135.0);
    break;
  case '\x04':
    TAngle<double>::operator=(&(actor->Angles).Yaw,180.0);
    break;
  case '\x05':
    TAngle<double>::operator=(&(actor->Angles).Yaw,225.0);
    break;
  case '\x06':
    TAngle<double>::operator=(&(actor->Angles).Yaw,270.0);
    break;
  case '\a':
    TAngle<double>::operator=(&(actor->Angles).Yaw,315.0);
  }
  return;
}

Assistant:

void FaceMovementDirection(AActor *actor)
{
	switch (actor->movedir)
	{
	case DI_EAST:
		actor->Angles.Yaw = 0.;
		break;
	case DI_NORTHEAST:
		actor->Angles.Yaw = 45.;
		break;
	case DI_NORTH:
		actor->Angles.Yaw = 90.;
		break;
	case DI_NORTHWEST:
		actor->Angles.Yaw = 135.;
		break;
	case DI_WEST:
		actor->Angles.Yaw = 180.;
		break;
	case DI_SOUTHWEST:
		actor->Angles.Yaw = 225.;
		break;
	case DI_SOUTH:
		actor->Angles.Yaw = 270.;
		break;
	case DI_SOUTHEAST:
		actor->Angles.Yaw = 315.;
		break;
	}
}